

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * GenImagePerlinNoise(Image *__return_storage_ptr__,int width,int height,int offsetX,
                           int offsetY,float scale)

{
  undefined1 uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int x;
  ulong uVar7;
  float fVar8;
  
  pvVar2 = malloc((long)(height * width) << 2);
  uVar5 = 0;
  uVar4 = 0;
  if (0 < width) {
    uVar4 = (ulong)(uint)width;
  }
  uVar3 = 0;
  if (0 < height) {
    uVar3 = (ulong)(uint)height;
  }
  lVar6 = (long)pvVar2 + 3;
  for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      fVar8 = stb_perlin_fbm_noise3
                        (((float)((int)uVar7 + offsetX) * scale) / (float)width,
                         ((float)(offsetY + (int)uVar5) * scale) / (float)height,1.0,2.0,0.5,6);
      uVar1 = (undefined1)(int)((fVar8 + 1.0) * 0.5 * 255.0);
      *(undefined1 *)(lVar6 + -3 + uVar7 * 4) = uVar1;
      *(undefined1 *)(lVar6 + -2 + uVar7 * 4) = uVar1;
      *(undefined1 *)(lVar6 + -1 + uVar7 * 4) = uVar1;
      *(undefined1 *)(lVar6 + uVar7 * 4) = 0xff;
    }
    lVar6 = lVar6 + (long)width * 4;
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImagePerlinNoise(int width, int height, int offsetX, int offsetY, float scale)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float nx = (float)(x + offsetX)*scale/(float)width;
            float ny = (float)(y + offsetY)*scale/(float)height;

            // Typical values to start playing with:
            //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
            //   gain       =  0.5   -- relative weighting applied to each successive octave
            //   octaves    =  6     -- number of "octaves" of noise3() to sum

            // NOTE: We need to translate the data from [-1..1] to [0..1]
            float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f)/2.0f;

            int intensity = (int)(p*255.0f);
            pixels[y*width + x] = (Color){intensity, intensity, intensity, 255};
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}